

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O3

bool __thiscall
CppJieba::MixSegment::cut
          (MixSegment *this,const_iterator begin,const_iterator end,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  pointer puVar1;
  pointer pvVar2;
  pointer pvVar3;
  HMMSegment *this_00;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ushort *puVar9;
  ushort *puVar10;
  char cVar11;
  pointer pvVar12;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  hmmRes;
  Unicode unico;
  string tmp;
  vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> infos;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_d8;
  const_iterator local_b8;
  iterator iStack_b0;
  unsigned_short *local_a8;
  value_type local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> local_78;
  HMMSegment *local_60;
  long local_58;
  string local_50;
  
  local_80 = res;
  if ((this->super_SegmentBase)._isInited == false) {
    __assert_fail("_getInitFlag()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                  ,0x3c,
                  "virtual bool CppJieba::MixSegment::cut(Unicode::const_iterator, Unicode::const_iterator, vector<string> &) const"
                 );
  }
  if (begin._M_current == end._M_current) {
    return false;
  }
  local_78.super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = MPSegment::cut(&this->_mpSeg,begin,end,&local_78);
  if (!bVar4) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"mpSeg cutDAG failed.","");
    Limonp::Logger::LoggingF(3,"MixSegment.hpp",0x44,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    bVar4 = false;
    goto LAB_00112036;
  }
  local_b8._M_current = (unsigned_short *)0x0;
  iStack_b0._M_current = (unsigned_short *)0x0;
  uVar8 = 0;
  local_a8 = (unsigned_short *)0x0;
  local_d8.
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  bVar4 = true;
  if (local_78.super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_78.super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_60 = &this->_hmmSeg;
    do {
      local_58 = uVar8 * 9;
      puVar10 = local_78.
                super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar8].word.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar9 = local_78.
               super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar8].word.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
      cVar11 = (char)&local_a0;
      if (puVar10 < puVar9) {
        local_a0._M_string_length = 0;
        *local_a0._M_dataplus._M_p = '\0';
        do {
          if (0x7f < *puVar10) {
            if (*puVar10 < 0x800) {
              std::__cxx11::string::push_back(cVar11);
            }
            else {
              std::__cxx11::string::push_back(cVar11);
              std::__cxx11::string::push_back(cVar11);
            }
          }
          std::__cxx11::string::push_back(cVar11);
          puVar10 = puVar10 + 1;
        } while (puVar10 != puVar9);
        puVar10 = (&((local_78.
                      super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start)->word).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start)[local_58];
        puVar9 = (&((local_78.
                     super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start)->word).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish)[local_58];
      }
      pvVar3 = local_d8.
               super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pvVar2 = local_d8.
               super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)puVar9 - (long)puVar10 == 2) {
        if (iStack_b0._M_current == local_a8) {
          std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>
                    ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_b8,iStack_b0,
                     puVar10);
        }
        else {
          *iStack_b0._M_current = *puVar10;
          iStack_b0._M_current = iStack_b0._M_current + 1;
        }
      }
      else {
        if (local_b8._M_current != iStack_b0._M_current) {
          pvVar12 = local_d8.
                    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_d8.
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_d8.
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            do {
              puVar1 = (pvVar12->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if (puVar1 != (pointer)0x0) {
                operator_delete(puVar1);
              }
              pvVar12 = pvVar12 + 1;
            } while (pvVar12 != pvVar3);
            local_d8.
            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
          }
          bVar4 = HMMSegment::cut(local_60,local_b8,(const_iterator)iStack_b0._M_current,&local_d8);
          if (!bVar4) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"_hmmSeg cut failed.","");
            Limonp::Logger::LoggingF(3,"MixSegment.hpp",0x58,&local_50);
            goto LAB_00111ff7;
          }
          if (local_d8.
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_d8.
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar7 = 0;
            do {
              puVar10 = local_d8.
                        super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7].
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar9 = local_d8.
                       super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar7].
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (puVar10 < puVar9) {
                local_a0._M_string_length = 0;
                *local_a0._M_dataplus._M_p = '\0';
                do {
                  if (0x7f < *puVar10) {
                    if (*puVar10 < 0x800) {
                      std::__cxx11::string::push_back(cVar11);
                    }
                    else {
                      std::__cxx11::string::push_back(cVar11);
                      std::__cxx11::string::push_back(cVar11);
                    }
                  }
                  std::__cxx11::string::push_back(cVar11);
                  puVar10 = puVar10 + 1;
                } while (puVar10 != puVar9);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_80,&local_a0);
              uVar7 = (ulong)((int)uVar7 + 1);
              uVar6 = ((long)local_d8.
                             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_d8.
                             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
          }
        }
        if (iStack_b0._M_current != local_b8._M_current) {
          iStack_b0._M_current = local_b8._M_current;
        }
        puVar10 = (&((local_78.
                      super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start)->word).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start)[local_58];
        puVar9 = (&((local_78.
                     super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start)->word).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish)[local_58];
        if (puVar10 < puVar9) {
          local_a0._M_string_length = 0;
          *local_a0._M_dataplus._M_p = '\0';
          do {
            if (0x7f < *puVar10) {
              if (*puVar10 < 0x800) {
                std::__cxx11::string::push_back(cVar11);
              }
              else {
                std::__cxx11::string::push_back(cVar11);
                std::__cxx11::string::push_back(cVar11);
              }
            }
            std::__cxx11::string::push_back(cVar11);
            puVar10 = puVar10 + 1;
          } while (puVar10 != puVar9);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_80,&local_a0);
      }
      this_00 = local_60;
      pvVar3 = local_d8.
               super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pvVar2 = local_d8.
               super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (ulong)((int)uVar8 + 1);
      uVar7 = ((long)local_78.
                     super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_78.
                     super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
    } while (uVar8 <= uVar7 && uVar7 - uVar8 != 0);
    if (local_b8._M_current == iStack_b0._M_current) {
LAB_00111f04:
      bVar4 = true;
    }
    else {
      bVar4 = true;
      pvVar12 = local_d8.
                super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_d8.
          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_d8.
          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          puVar1 = (pvVar12->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (puVar1 != (pointer)0x0) {
            operator_delete(puVar1);
          }
          pvVar12 = pvVar12 + 1;
        } while (pvVar12 != pvVar3);
        local_d8.
        super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
      }
      bVar5 = HMMSegment::cut(this_00,local_b8,(const_iterator)iStack_b0._M_current,&local_d8);
      if (bVar5) {
        if (local_d8.
            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_d8.
            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar8 = 0;
          do {
            puVar10 = local_d8.
                      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar8].
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar9 = local_d8.
                     super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8].
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (puVar10 < puVar9) {
              local_a0._M_string_length = 0;
              *local_a0._M_dataplus._M_p = '\0';
              do {
                cVar11 = (char)&local_a0;
                if (0x7f < *puVar10) {
                  if (*puVar10 < 0x800) {
                    std::__cxx11::string::push_back(cVar11);
                  }
                  else {
                    std::__cxx11::string::push_back(cVar11);
                    std::__cxx11::string::push_back(cVar11);
                  }
                }
                std::__cxx11::string::push_back(cVar11);
                puVar10 = puVar10 + 1;
              } while (puVar10 != puVar9);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_80,&local_a0);
            uVar8 = (ulong)((int)uVar8 + 1);
            uVar7 = ((long)local_d8.
                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_d8.
                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          } while (uVar8 <= uVar7 && uVar7 - uVar8 != 0);
          goto LAB_00111f04;
        }
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"_hmmSeg cut failed.","");
        Limonp::Logger::LoggingF(3,"MixSegment.hpp",0x6b,&local_50);
LAB_00111ff7:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        bVar4 = false;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_d8);
  if (local_b8._M_current != (unsigned_short *)0x0) {
    operator_delete(local_b8._M_current);
  }
LAB_00112036:
  std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::~vector(&local_78);
  return bVar4;
}

Assistant:

virtual bool cut(Unicode::const_iterator begin, Unicode::const_iterator end, vector<string>& res)const
            {
				assert(_getInitFlag());
                if(begin == end)
                {
                    return false;
                }
                vector<TrieNodeInfo> infos;
                if(!_mpSeg.cut(begin, end, infos))
                {
                    LogError("mpSeg cutDAG failed.");
                    return false;
                }
                Unicode unico;
                vector<Unicode> hmmRes;
                string tmp;
                for(uint i= 0; i < infos.size(); i++)
                {
                    TransCode::encode(infos[i].word,tmp);
                    if(1 == infos[i].word.size())
                    {
                        unico.push_back(infos[i].word[0]);
                    }
                    else
                    {
                        if(!unico.empty())
                        {
                            hmmRes.clear();
                            if(!_hmmSeg.cut(unico.begin(), unico.end(), hmmRes))
                            {
                                LogError("_hmmSeg cut failed.");
                                return false;
                            }
                            for(uint j = 0; j < hmmRes.size(); j++)
                            {
                                TransCode::encode(hmmRes[j], tmp);
                                res.push_back(tmp);
                            }
                        }
                        unico.clear();
                        TransCode::encode(infos[i].word, tmp);
                        res.push_back(tmp);
                    }
                }
                if(!unico.empty())
                {
                    hmmRes.clear();
                    if(!_hmmSeg.cut(unico.begin(), unico.end(), hmmRes))
                    {
                        LogError("_hmmSeg cut failed.");
                        return false;
                    }
                    for(uint j = 0; j < hmmRes.size(); j++)
                    {
                        TransCode::encode(hmmRes[j], tmp);
                        res.push_back(tmp);
                    }
                }

                return true;
            }